

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O2

int libssh2_userauth_keyboard_interactive_ex
              (LIBSSH2_SESSION *session,char *user,uint user_len,
              _func_void_char_ptr_int_char_ptr_int_int_LIBSSH2_USERAUTH_KBDINT_PROMPT_ptr_LIBSSH2_USERAUTH_KBDINT_RESPONSE_ptr_void_ptr_ptr
              *response_callback)

{
  int iVar1;
  time_t start_time;
  uchar *puVar2;
  LIBSSH2_USERAUTH_KBDINT_PROMPT *pLVar3;
  LIBSSH2_USERAUTH_KBDINT_RESPONSE *pLVar4;
  size_t sVar5;
  char *pcVar6;
  LIBSSH2_USERAUTH_KBDINT_PROMPT *pLVar7;
  ulong uVar8;
  long lVar9;
  uchar *local_68;
  LIBSSH2_USERAUTH_KBDINT_PROMPT **local_60;
  _func_void_char_ptr_int_char_ptr_int_int_LIBSSH2_USERAUTH_KBDINT_PROMPT_ptr_LIBSSH2_USERAUTH_KBDINT_RESPONSE_ptr_void_ptr_ptr
  *local_58;
  ulong local_50;
  char *local_48;
  size_t local_40;
  packet_requirev_state_t *local_38;
  
  local_58 = response_callback;
  local_48 = user;
  start_time = time((time_t *)0x0);
  local_60 = &session->userauth_kybd_prompts;
  local_40 = (size_t)(user_len + 0x37);
  local_38 = &session->userauth_kybd_packet_requirev_state;
  local_50 = (ulong)user_len;
LAB_0012a18a:
  switch(session->userauth_kybd_state) {
  case libssh2_NB_state_idle:
    session->userauth_kybd_auth_name = (uchar *)0x0;
    session->userauth_kybd_auth_instruction = (uchar *)0x0;
    session->userauth_kybd_num_prompts = 0;
    session->userauth_kybd_auth_failure = 1;
    *local_60 = (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0;
    local_60[1] = (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0;
    ((packet_requirev_state_t *)(local_60 + 2))->start = 0;
    session->userauth_kybd_packet_len = local_40;
    puVar2 = (uchar *)(*session->alloc)(local_40,&session->abstract);
    session->userauth_kybd_data = puVar2;
    if (puVar2 != (uchar *)0x0) {
      local_68 = puVar2 + 1;
      *puVar2 = '2';
      _libssh2_store_str(&local_68,local_48,local_50);
      _libssh2_store_str(&local_68,"ssh-connection",0xe);
      _libssh2_store_str(&local_68,"keyboard-interactive",0x14);
      _libssh2_store_u32(&local_68,0);
      _libssh2_store_u32(&local_68,0);
      session->userauth_kybd_state = libssh2_NB_state_created;
      goto switchD_0012a1a8_caseD_2;
    }
    iVar1 = -6;
    pcVar6 = "Unable to allocate memory for keyboard-interactive authentication";
    break;
  default:
    goto switchD_0012a1a8_caseD_1;
  case libssh2_NB_state_created:
switchD_0012a1a8_caseD_2:
    iVar1 = _libssh2_transport_send
                      (session,session->userauth_kybd_data,session->userauth_kybd_packet_len,
                       (uchar *)0x0,0);
    if (iVar1 == 0) {
      (*session->free)(session->userauth_kybd_data,&session->abstract);
      session->userauth_kybd_data = (uchar *)0x0;
      do {
        session->userauth_kybd_state = libssh2_NB_state_sent;
switchD_0012a1a8_caseD_3:
        iVar1 = _libssh2_packet_requirev
                          (session,"43<",&session->userauth_kybd_data,
                           &session->userauth_kybd_data_len,0,(uchar *)0x0,0,local_38);
        if (iVar1 != 0) {
          if (iVar1 == -0x25) goto LAB_0012a5e4;
LAB_0012a4f5:
          session->userauth_kybd_state = libssh2_NB_state_idle;
          iVar1 = -0x12;
          pcVar6 = "Waiting for keyboard USERAUTH response";
          goto LAB_0012a5f1;
        }
        if (session->userauth_kybd_data_len == 0) goto LAB_0012a4f5;
        puVar2 = session->userauth_kybd_data;
        if (*puVar2 == '3') goto LAB_0012a50e;
        if (*puVar2 == '4') {
          (*session->free)(puVar2,&session->abstract);
          session->userauth_kybd_data = (uchar *)0x0;
          *(byte *)&session->state = (byte)session->state | 8;
          iVar1 = 0;
          goto LAB_0012a644;
        }
        iVar1 = userauth_keyboard_interactive_decode_info_request(session);
        if (-1 < iVar1) {
          (*local_58)((char *)session->userauth_kybd_auth_name,
                      (int)session->userauth_kybd_auth_name_len,
                      (char *)session->userauth_kybd_auth_instruction,
                      (int)session->userauth_kybd_auth_instruction_len,
                      session->userauth_kybd_num_prompts,session->userauth_kybd_prompts,
                      session->userauth_kybd_responses,&session->abstract);
          session->userauth_kybd_packet_len = 5;
          sVar5 = 5;
          for (lVar9 = 0; (ulong)session->userauth_kybd_num_prompts << 4 != lVar9;
              lVar9 = lVar9 + 0x10) {
            uVar8 = (ulong)*(uint *)((long)&session->userauth_kybd_responses->length + lVar9);
            if (-sVar5 - 5 < uVar8) goto LAB_0012a5a7;
            sVar5 = sVar5 + uVar8 + 4;
            session->userauth_kybd_packet_len = sVar5;
          }
          (*session->free)(session->userauth_kybd_data,&session->abstract);
          local_68 = (uchar *)(*session->alloc)(session->userauth_kybd_packet_len,&session->abstract
                                               );
          session->userauth_kybd_data = local_68;
          if (local_68 == (uchar *)0x0) {
LAB_0012a5a7:
            iVar1 = -6;
            pcVar6 = "Unable to allocate memory for keyboard-interactive response packet";
          }
          else {
            *local_68 = '=';
            local_68 = local_68 + 1;
            _libssh2_store_u32(&local_68,session->userauth_kybd_num_prompts);
            lVar9 = 8;
            for (uVar8 = 0; uVar8 < session->userauth_kybd_num_prompts; uVar8 = uVar8 + 1) {
              _libssh2_store_str(&local_68,
                                 *(char **)((long)session->userauth_kybd_responses + lVar9 + -8),
                                 (ulong)*(uint *)((long)&session->userauth_kybd_responses->text +
                                                 lVar9));
              lVar9 = lVar9 + 0x10;
            }
            session->userauth_kybd_state = libssh2_NB_state_sent1;
switchD_0012a1a8_caseD_4:
            iVar1 = _libssh2_transport_send
                              (session,session->userauth_kybd_data,session->userauth_kybd_packet_len
                               ,(uchar *)0x0,0);
            if (iVar1 == 0) {
              session->userauth_kybd_auth_failure = 0;
              goto switchD_0012a1a8_caseD_1;
            }
            if (iVar1 == -0x25) goto LAB_0012a5e4;
            iVar1 = -7;
            pcVar6 = "Unable to send userauth-keyboard-interactive request";
          }
          _libssh2_error(session,iVar1,pcVar6);
        }
switchD_0012a1a8_caseD_1:
        (*session->free)(session->userauth_kybd_data,&session->abstract);
        session->userauth_kybd_data = (uchar *)0x0;
        pLVar3 = session->userauth_kybd_prompts;
        pLVar7 = (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0;
        if (pLVar3 != (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0) {
          lVar9 = 0;
          for (uVar8 = 0; pLVar7 = pLVar3, uVar8 < session->userauth_kybd_num_prompts;
              uVar8 = uVar8 + 1) {
            (*session->free)(*(void **)((long)&pLVar3->text + lVar9),&session->abstract);
            pLVar3 = session->userauth_kybd_prompts;
            *(undefined8 *)((long)&pLVar3->text + lVar9) = 0;
            lVar9 = lVar9 + 0x18;
          }
        }
        pLVar4 = (LIBSSH2_USERAUTH_KBDINT_RESPONSE *)0x0;
        if (session->userauth_kybd_responses != (LIBSSH2_USERAUTH_KBDINT_RESPONSE *)0x0) {
          lVar9 = 0;
          pLVar4 = session->userauth_kybd_responses;
          for (uVar8 = 0; uVar8 < session->userauth_kybd_num_prompts; uVar8 = uVar8 + 1) {
            (*session->free)(*(void **)((long)&pLVar4->text + lVar9),&session->abstract);
            pLVar4 = session->userauth_kybd_responses;
            *(undefined8 *)((long)&pLVar4->text + lVar9) = 0;
            lVar9 = lVar9 + 0x10;
          }
          pLVar7 = *local_60;
        }
        if (pLVar7 != (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0) {
          (*session->free)(pLVar7,&session->abstract);
          session->userauth_kybd_prompts = (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0;
          pLVar4 = session->userauth_kybd_responses;
        }
        if (pLVar4 != (LIBSSH2_USERAUTH_KBDINT_RESPONSE *)0x0) {
          (*session->free)(pLVar4,&session->abstract);
          session->userauth_kybd_responses = (LIBSSH2_USERAUTH_KBDINT_RESPONSE *)0x0;
        }
        if (session->userauth_kybd_auth_name != (uchar *)0x0) {
          (*session->free)(session->userauth_kybd_auth_name,&session->abstract);
          session->userauth_kybd_auth_name = (uchar *)0x0;
        }
        if (session->userauth_kybd_auth_instruction != (uchar *)0x0) {
          (*session->free)(session->userauth_kybd_auth_instruction,&session->abstract);
          session->userauth_kybd_auth_instruction = (uchar *)0x0;
        }
        if (session->userauth_kybd_auth_failure != 0) {
          iVar1 = -1;
LAB_0012a644:
          session->userauth_kybd_state = libssh2_NB_state_idle;
          return iVar1;
        }
      } while( true );
    }
    if (iVar1 == -0x25) {
LAB_0012a5e4:
      iVar1 = -0x25;
      pcVar6 = "Would block";
    }
    else {
      (*session->free)(session->userauth_kybd_data,&session->abstract);
      session->userauth_kybd_data = (uchar *)0x0;
      session->userauth_kybd_state = libssh2_NB_state_idle;
      iVar1 = -7;
      pcVar6 = "Unable to send keyboard-interactive request";
    }
    break;
  case libssh2_NB_state_sent:
    goto switchD_0012a1a8_caseD_3;
  case libssh2_NB_state_sent1:
    goto switchD_0012a1a8_caseD_4;
  }
  goto LAB_0012a5f1;
LAB_0012a50e:
  (*session->free)(puVar2,&session->abstract);
  session->userauth_kybd_data = (uchar *)0x0;
  session->userauth_kybd_state = libssh2_NB_state_idle;
  iVar1 = -0x12;
  pcVar6 = "Authentication failed (keyboard-interactive)";
LAB_0012a5f1:
  iVar1 = _libssh2_error(session,iVar1,pcVar6);
  if (iVar1 != -0x25) {
    return iVar1;
  }
  if (session->api_block_mode == 0) {
    return -0x25;
  }
  iVar1 = _libssh2_wait_socket(session,start_time);
  if (iVar1 != 0) {
    return iVar1;
  }
  goto LAB_0012a18a;
}

Assistant:

LIBSSH2_API int
libssh2_userauth_keyboard_interactive_ex(LIBSSH2_SESSION *session,
                                         const char *user,
                                         unsigned int user_len,
                                         LIBSSH2_USERAUTH_KBDINT_RESPONSE_FUNC
                                             ((*response_callback)))
{
    int rc;
    BLOCK_ADJUST(rc, session,
                 userauth_keyboard_interactive(session, user, user_len,
                                               response_callback));
    return rc;
}